

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O2

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToUnmappedArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  uint i;
  uint index;
  
  ConvertToES5HeapArgumentsObject(this,overwriteArgsUsingFrameObject);
  for (index = 0; (index < this->formalCount && (index < (*(uint *)&this->field_0x20 & 0x7fffffff)))
      ; index = index + 1) {
    ES5HeapArgumentsObject::DisconnectFormalFromNamedArgument((ES5HeapArgumentsObject *)this,index);
  }
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToUnmappedArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        ES5HeapArgumentsObject* es5ArgsObj = ConvertToES5HeapArgumentsObject(overwriteArgsUsingFrameObject);

        for (uint i=0; i<this->formalCount && i<numOfArguments; ++i)
        {
            es5ArgsObj->DisconnectFormalFromNamedArgument(i);
        }

        return es5ArgsObj;
    }